

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall capnp::compiler::Compiler::Impl::clearWorkspace(Impl *this)

{
  Workspace *this_00;
  SchemaLoader *this_01;
  Arena *this_02;
  Orphanage OVar1;
  
  this_00 = &this->workspace;
  this_01 = &(this->workspace).bootstrapLoader;
  SchemaLoader::~SchemaLoader(this_01);
  this_02 = &(this->workspace).arena;
  kj::Arena::~Arena(this_02);
  MallocMessageBuilder::~MallocMessageBuilder(&this_00->message);
  MallocMessageBuilder::MallocMessageBuilder(&this_00->message,0x400,GROW_HEURISTICALLY);
  OVar1 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  (this->workspace).orphanage = OVar1;
  kj::Arena::Arena(this_02,0x400);
  SchemaLoader::SchemaLoader(this_01,&this->super_LazyLoadCallback);
  return;
}

Assistant:

void Compiler::Impl::clearWorkspace() {
  // Make sure we reconstruct the workspace even if destroying it throws an exception.
  KJ_DEFER(kj::ctor(workspace, *this));
  kj::dtor(workspace);
}